

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

PSymbol * __thiscall PSymbolTable::AddSymbol(PSymbolTable *this,PSymbol *sym)

{
  PSymbol **ppPVar1;
  PSymbol *local_20;
  FName local_18;
  FName local_14;
  
  local_14.Index = *(int *)&(sym->super_DObject).field_0x24;
  local_20 = sym;
  ppPVar1 = TMap<FName,_PSymbol_*,_THashTraits<FName>,_TValueTraits<PSymbol_*>_>::CheckKey
                      (&this->Symbols,&local_14);
  if (ppPVar1 == (PSymbol **)0x0) {
    local_18.Index = *(int *)&(sym->super_DObject).field_0x24;
    TMap<FName,_PSymbol_*,_THashTraits<FName>,_TValueTraits<PSymbol_*>_>::Insert
              (&this->Symbols,&local_18,&local_20);
  }
  else {
    local_20 = (PSymbol *)0x0;
  }
  return local_20;
}

Assistant:

PSymbol *PSymbolTable::AddSymbol (PSymbol *sym)
{
	// Symbols that already exist are not inserted.
	if (Symbols.CheckKey(sym->SymbolName) != NULL)
	{
		return NULL;
	}
	Symbols.Insert(sym->SymbolName, sym);
	return sym;
}